

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::
FunctionMocker<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)>::Invoke
          (FunctionMocker<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this
          ,Position *args)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<std::optional<unsigned_int>_> *__p;
  pointer this_00;
  optional<unsigned_int> oVar1;
  unique_ptr<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>,_std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>_>_>
  local_30;
  unique_ptr<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>,_std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>_>_>
  holder;
  ArgumentTuple tuple;
  Position *args_local;
  FunctionMocker<std::optional<unsigned_int>_(const_solitaire::geometry::Position_&)> *this_local;
  
  std::tuple<const_solitaire::geometry::Position_&>::tuple<true,_true>
            ((tuple<const_solitaire::geometry::Position_&> *)&holder,args);
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<std::optional<unsigned_int>>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<std::optional<unsigned_int>>,std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<std::optional<unsigned_int>>,std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>>>>
              *)&local_30,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>,_std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>_>_>
            ::operator->(&local_30);
  oVar1 = ActionResultHolder<std::optional<unsigned_int>_>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>,_std::default_delete<testing::internal::ActionResultHolder<std::optional<unsigned_int>_>_>_>
  ::~unique_ptr(&local_30);
  return (Result)(_Optional_payload<unsigned_int,_true,_true,_true>)
                 oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }